

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

void __thiscall Assimp::X3DImporter::ParseNode_Head(X3DImporter *this)

{
  size_t *psVar1;
  CX3DImporter_NodeElement *pCVar2;
  FIReader *pFVar3;
  int iVar4;
  _List_node_base *p_Var5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _List_node_base *p_Var6;
  X3DImporter *this_00;
  char *__end;
  allocator<char> local_69;
  undefined1 local_68 [8];
  _List_node_base *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Base_ptr local_48;
  _Base_ptr local_40;
  _List_node_base *local_38;
  
  iVar4 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
  if ((char)iVar4 != '\0') {
    local_48 = (_Base_ptr)&this->NodeElement_List;
    do {
      iVar4 = (*(((this->mReader)._M_t.
                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
      if (iVar4 == 1) {
        local_68 = (undefined1  [8])&local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"meta","");
        (*(((this->mReader)._M_t.
            super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
            super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
            super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
          super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
        iVar4 = std::__cxx11::string::compare((char *)local_68);
        if (local_68 != (undefined1  [8])&local_58) {
          operator_delete((void *)local_68,
                          CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]) +
                          1);
        }
        if (iVar4 == 0) {
          XML_CheckNode_MustBeEmpty(this);
          p_Var5 = (_List_node_base *)operator_new(0xa8);
          pCVar2 = this->NodeElement_Cur;
          *(undefined4 *)&p_Var5->_M_prev = 6;
          p_Var5[1]._M_next = p_Var5 + 2;
          p_Var5[1]._M_prev = (_List_node_base *)0x0;
          *(undefined1 *)&p_Var5[2]._M_next = 0;
          p_Var5[3]._M_next = (_List_node_base *)pCVar2;
          p_Var5[4]._M_next = (_List_node_base *)&p_Var5[3]._M_prev;
          p_Var5[3]._M_prev = (_List_node_base *)&p_Var5[3]._M_prev;
          p_Var5[4]._M_prev = (_List_node_base *)0x0;
          local_38 = p_Var5 + 5;
          p_Var5[5]._M_next = p_Var5 + 6;
          p_Var5[5]._M_prev = (_List_node_base *)0x0;
          *(undefined1 *)&p_Var5[6]._M_next = 0;
          p_Var5[7]._M_next = p_Var5 + 8;
          p_Var5[7]._M_prev = (_List_node_base *)0x0;
          *(undefined1 *)&p_Var5[8]._M_next = 0;
          p_Var5->_M_next = (_List_node_base *)&PTR__CX3DImporter_NodeElement_MetaString_008cf620;
          local_40 = (_Base_ptr)(p_Var5 + 9);
          p_Var5[9]._M_prev = (_List_node_base *)local_40;
          p_Var5[9]._M_next = (_List_node_base *)local_40;
          p_Var5[10]._M_next = (_List_node_base *)0x0;
          iVar4 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[8])();
          p_Var6 = p_Var5[5]._M_prev;
          strlen((char *)CONCAT44(extraout_var,iVar4));
          std::__cxx11::string::_M_replace
                    ((ulong)local_38,0,(char *)p_Var6,CONCAT44(extraout_var,iVar4));
          if (p_Var5[5]._M_prev != (_List_node_base *)0x0) {
            pFVar3 = (this->mReader)._M_t.
                     super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                     .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
            iVar4 = (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[8])
                              (pFVar3,"content");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_68,(char *)CONCAT44(extraout_var_00,iVar4),&local_69);
            p_Var6 = (_List_node_base *)operator_new(0x30);
            p_Var6[1]._M_next = p_Var6 + 2;
            if (local_68 == (undefined1  [8])&local_58) {
              p_Var6[2]._M_next =
                   (_List_node_base *)
                   CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]);
              p_Var6[2]._M_prev = (_List_node_base *)local_58._8_8_;
            }
            else {
              p_Var6[1]._M_next = (_List_node_base *)local_68;
              p_Var6[2]._M_next =
                   (_List_node_base *)
                   CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]);
            }
            p_Var6[1]._M_prev = local_60;
            local_60 = (_List_node_base *)0x0;
            local_58._M_local_buf[0] = '\0';
            local_68 = (undefined1  [8])&local_58;
            std::__detail::_List_node_base::_M_hook(p_Var6);
            p_Var5[10]._M_next = (_List_node_base *)((long)&(p_Var5[10]._M_next)->_M_next + 1);
            if (local_68 != (undefined1  [8])&local_58) {
              operator_delete((void *)local_68,
                              CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]
                                      ) + 1);
            }
            p_Var6 = (_List_node_base *)operator_new(0x18);
            p_Var6[1]._M_next = p_Var5;
            std::__detail::_List_node_base::_M_hook(p_Var6);
            psVar1 = &(this->NodeElement_List).
                      super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                      ._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            pCVar2 = this->NodeElement_Cur;
            if (pCVar2 != (CX3DImporter_NodeElement *)0x0) {
              p_Var6 = (_List_node_base *)operator_new(0x18);
              p_Var6[1]._M_next = p_Var5;
              std::__detail::_List_node_base::_M_hook(p_Var6);
              psVar1 = &(pCVar2->Child).
                        super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                        ._M_impl._M_node._M_size;
              *psVar1 = *psVar1 + 1;
              goto LAB_00626107;
            }
          }
          (*(code *)p_Var5->_M_next->_M_prev)(p_Var5);
        }
      }
      else {
        iVar4 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        if (iVar4 == 2) {
          local_68 = (undefined1  [8])&local_58;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"head","");
          (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
          iVar4 = std::__cxx11::string::compare((char *)local_68);
          if (local_68 != (undefined1  [8])&local_58) {
            operator_delete((void *)local_68,
                            CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0])
                            + 1);
          }
          if (iVar4 == 0) {
            return;
          }
        }
      }
LAB_00626107:
      iVar4 = (*(((this->mReader)._M_t.
                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
    } while ((char)iVar4 != '\0');
  }
  local_68 = (undefined1  [8])&local_58;
  this_00 = (X3DImporter *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"head","");
  Throw_CloseNotFound(this_00,(string *)local_68);
  return;
}

Assistant:

void X3DImporter::ParseNode_Head()
{
    bool close_found = false;// flag: true if close tag of node are found.

	while(mReader->read())
	{
		if(mReader->getNodeType() == irr::io::EXN_ELEMENT)
		{
			if(XML_CheckNode_NameEqual("meta"))
			{
				XML_CheckNode_MustBeEmpty();

				// adding metadata from <head> as MetaString from <Scene>
                bool added( false );
                CX3DImporter_NodeElement_MetaString* ms = new CX3DImporter_NodeElement_MetaString(NodeElement_Cur);

				ms->Name = mReader->getAttributeValueSafe("name");
				// name must not be empty
				if(!ms->Name.empty())
				{
					ms->Value.push_back(mReader->getAttributeValueSafe("content"));
					NodeElement_List.push_back(ms);
                    if ( NodeElement_Cur != nullptr )
                    {
                        NodeElement_Cur->Child.push_back( ms );
                        added = true;
                    }
				}
                // if an error has occurred, release instance
                if ( !added ) {
                    delete ms;
                }
			}// if(XML_CheckNode_NameEqual("meta"))
		}// if(mReader->getNodeType() == irr::io::EXN_ELEMENT)
		else if(mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
		{
			if(XML_CheckNode_NameEqual("head"))
			{
				close_found = true;
				break;
			}
		}// if(mReader->getNodeType() == irr::io::EXN_ELEMENT) else
	}// while(mReader->read())

    if ( !close_found )
    {
        Throw_CloseNotFound( "head" );
    }
}